

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O2

_Bool rcnb_decode_short(wchar_t *value_in,char **value_out)

{
  char *pcVar1;
  uint uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  uint uVar9;
  long lStack_50;
  
  wVar6 = *value_in;
  wVar4 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,wVar6);
  if (wVar4 < L'\0') {
    wVar7 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,value_in[2]);
    wVar5 = find(L"cCĆćĈĉĊċČčƇƈÇȻȼ",0xf,value_in[3]);
    wVar6 = find(L"nNŃńŅņŇňƝƞÑǸǹȠȵ",0xf,wVar6);
    lStack_50 = 4;
  }
  else {
    wVar5 = find(L"cCĆćĈĉĊċČčƇƈÇȻȼ",0xf,value_in[1]);
    wVar6 = find(L"nNŃńŅņŇňƝƞÑǸǹȠȵ",0xf,value_in[2]);
    lStack_50 = 0xc;
    wVar7 = wVar4;
  }
  wVar8 = find(L"bBƀƁƃƄƅßÞþ",10,*(wchar_t *)((long)value_in + lStack_50));
  if (((wVar7 | wVar5 | wVar6 | wVar8) < 0) ||
     (uVar9 = ((wVar7 * 0xf + wVar5) * 0xf + wVar6) * 10 + wVar8, 0x7fff < uVar9)) {
    _Var3 = false;
  }
  else {
    uVar2 = uVar9 | 0x8000;
    if (L'\xffffffff' < wVar4) {
      uVar2 = uVar9;
    }
    pcVar1 = *value_out;
    *value_out = pcVar1 + 1;
    *pcVar1 = (char)(uVar2 >> 8);
    pcVar1 = *value_out;
    *value_out = pcVar1 + 1;
    *pcVar1 = (char)uVar2;
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool rcnb_decode_short(const wchar_t* value_in, char** value_out)
{
    bool reverse = find(cr, sr, *value_in) < 0;
    int idx[4];
    if (!reverse) {
        idx[0] = find(cr, sr, *value_in);
        idx[1] = find(cc, sc, *(value_in + 1));
        idx[2] = find(cn, sn, *(value_in + 2));
        idx[3] = find(cb, sb, *(value_in + 3));
    } else {
        idx[0] = find(cr, sr, *(value_in + 2));
        idx[1] = find(cc, sc, *(value_in + 3));
        idx[2] = find(cn, sn, *value_in);
        idx[3] = find(cb, sb, *(value_in + 1));
    }
    if (idx[0] < 0 || idx[1] < 0 || idx[2] < 0 || idx[3] < 0)
        return false;
    int result = idx[0] * scnb + idx[1] * snb + idx[2] * sb + idx[3];
    if (result > 0x7FFF)
        return false;
    result = reverse ? result | 0x8000 : result;
    *(*value_out)++ = (char)(result >> 8);
    *(*value_out)++ = (char)(result & 0xFF);
    return true;
}